

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

string * __thiscall
duckdb::Exception::ConstructMessageRecursive<duckdb::uhugeint_t,duckdb::uhugeint_t>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,uhugeint_t param,uhugeint_t params)

{
  uint64_t uVar1;
  uhugeint_t value;
  uhugeint_t param_00;
  ExceptionFormatValue EStack_58;
  
  uVar1 = param.upper;
  value.upper = (uint64_t)values;
  value.lower = param.lower;
  ExceptionFormatValue::CreateFormatValue<duckdb::uhugeint_t>
            (&EStack_58,(ExceptionFormatValue *)values,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,&EStack_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)EStack_58.str_val._M_dataplus._M_p != &EStack_58.str_val.field_2) {
    operator_delete(EStack_58.str_val._M_dataplus._M_p);
  }
  param_00.upper = uVar1;
  param_00.lower = params.upper;
  ConstructMessageRecursive<duckdb::uhugeint_t>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             params.lower,param_00);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}